

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O0

void TemplateCacheUnittest::TestGetTemplate(void)

{
  char *s;
  Template *pTVar1;
  bool bVar2;
  allocator local_329;
  string local_328 [32];
  TemplateString local_308;
  Template *local_2e8;
  Template *tpl6;
  string local_2d8 [32];
  TemplateString local_2b8;
  Template *local_298;
  Template *tpl5;
  TemplateCache cache2;
  TemplateString local_250;
  long local_230;
  Template *tpl4;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [32];
  TemplateString local_1b0;
  Template *local_190;
  Template *tpl3;
  Template *local_168;
  Template *tpl2;
  Template *local_140;
  Template *tpl1;
  string local_130 [32];
  ctemplate local_110 [8];
  string filename;
  TemplateString local_e0;
  TemplateDictionary local_c0 [8];
  TemplateDictionary empty_dict;
  char *text;
  TemplateCache cache1;
  
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)&text);
  ctemplate::TemplateString::TemplateString(&local_e0,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary(local_c0,&local_e0,(UnsafeArena *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_130,"{This is perfectly valid} yay!",(allocator *)((long)&tpl1 + 7));
  ctemplate::StringToTemplateFile(local_110,(string *)local_130);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl1 + 7));
  ctemplate::TemplateString::TemplateString((TemplateString *)&tpl2,(string *)local_110);
  local_140 = (Template *)
              ctemplate::TemplateCache::GetTemplate((TemplateString *)&text,(Strip)&tpl2);
  s = (char *)std::__cxx11::string::c_str();
  ctemplate::TemplateString::TemplateString((TemplateString *)&tpl3,s);
  local_168 = (Template *)
              ctemplate::TemplateCache::GetTemplate((TemplateString *)&text,(Strip)&tpl3);
  ctemplate::TemplateString::TemplateString(&local_1b0,(string *)local_110);
  local_190 = (Template *)
              ctemplate::TemplateCache::GetTemplate((TemplateString *)&text,(Strip)&local_1b0);
  pTVar1 = local_140;
  if (((local_140 == (Template *)0x0) || (local_168 == (Template *)0x0)) ||
     (local_190 == (Template *)0x0)) {
    printf("ASSERT FAILED, line %d: %s\n",0x60,"tpl1 && tpl2 && tpl3");
    bVar2 = false;
    if ((local_140 != (Template *)0x0) && (bVar2 = false, local_168 != (Template *)0x0)) {
      bVar2 = local_190 != (Template *)0x0;
    }
    if (!bVar2) {
      __assert_fail("tpl1 && tpl2 && tpl3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x60,"static void TemplateCacheUnittest::TestGetTemplate()");
    }
    exit(1);
  }
  if (local_140 != local_168) {
    printf("ASSERT FAILED, line %d: %s\n",0x61,"tpl1 == tpl2");
    if (local_140 == local_168) {
      exit(1);
    }
    __assert_fail("tpl1 == tpl2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x61,"static void TemplateCacheUnittest::TestGetTemplate()");
  }
  if (local_140 == local_190) {
    printf("ASSERT FAILED, line %d: %s\n",0x62,"tpl1 != tpl3");
    if (local_140 != local_190) {
      exit(1);
    }
    __assert_fail("tpl1 != tpl3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x62,"static void TemplateCacheUnittest::TestGetTemplate()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"{This is perfectly valid} yay!",&local_1d1);
  ctemplate::AssertExpandIs(pTVar1,local_c0,(string *)local_1d0,true);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  pTVar1 = local_168;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"{This is perfectly valid} yay!",&local_1f9);
  ctemplate::AssertExpandIs(pTVar1,local_c0,(string *)local_1f8,true);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  pTVar1 = local_190;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_220,"{This is perfectly valid} yay!",(allocator *)((long)&tpl4 + 7));
  ctemplate::AssertExpandIs(pTVar1,local_c0,(string *)local_220,true);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl4 + 7));
  ctemplate::TemplateString::TemplateString(&local_250,"/yakakak");
  local_230 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&text,(Strip)&local_250);
  if (local_230 != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x69,"!tpl4");
    if (local_230 != 0) {
      __assert_fail("!tpl4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x69,"static void TemplateCacheUnittest::TestGetTemplate()");
    }
    exit(1);
  }
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)&tpl5);
  ctemplate::TemplateString::TemplateString(&local_2b8,(string *)local_110);
  pTVar1 = (Template *)
           ctemplate::TemplateCache::GetTemplate((TemplateString *)&tpl5,(Strip)&local_2b8);
  local_298 = pTVar1;
  if (pTVar1 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x6e,"tpl5");
    if (local_298 != (Template *)0x0) {
      exit(1);
    }
    __assert_fail("tpl5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x6e,"static void TemplateCacheUnittest::TestGetTemplate()");
  }
  if (pTVar1 == local_140) {
    printf("ASSERT FAILED, line %d: %s\n",0x6f,"tpl5 != tpl1");
    if (local_298 != local_140) {
      exit(1);
    }
    __assert_fail("tpl5 != tpl1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x6f,"static void TemplateCacheUnittest::TestGetTemplate()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2d8,"{This is perfectly valid} yay!",(allocator *)((long)&tpl6 + 7));
  ctemplate::AssertExpandIs(pTVar1,local_c0,(string *)local_2d8,true);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl6 + 7));
  ctemplate::TemplateString::TemplateString(&local_308,(string *)local_110);
  pTVar1 = (Template *)ctemplate::Template::GetTemplate(&local_308,DO_NOT_STRIP);
  local_2e8 = pTVar1;
  if (pTVar1 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x74,"tpl6");
    if (local_2e8 != (Template *)0x0) {
      exit(1);
    }
    __assert_fail("tpl6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x74,"static void TemplateCacheUnittest::TestGetTemplate()");
  }
  if (pTVar1 != local_140) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_328,"{This is perfectly valid} yay!",&local_329);
    ctemplate::AssertExpandIs(pTVar1,local_c0,(string *)local_328,true);
    std::__cxx11::string::~string(local_328);
    std::allocator<char>::~allocator((allocator<char> *)&local_329);
    ctemplate::TemplateCache::~TemplateCache((TemplateCache *)&tpl5);
    std::__cxx11::string::~string((string *)local_110);
    ctemplate::TemplateDictionary::~TemplateDictionary(local_c0);
    ctemplate::TemplateCache::~TemplateCache((TemplateCache *)&text);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0x75,"tpl6 != tpl1");
  if (local_2e8 != local_140) {
    exit(1);
  }
  __assert_fail("tpl6 != tpl1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                ,0x75,"static void TemplateCacheUnittest::TestGetTemplate()");
}

Assistant:

static void TestGetTemplate() {
    // Tests the cache
    TemplateCache cache1;
    const char* text = "{This is perfectly valid} yay!";
    TemplateDictionary empty_dict("dict");

    string filename = StringToTemplateFile(text);
    const Template* tpl1 = cache1.GetTemplate(filename, DO_NOT_STRIP);
    const Template* tpl2 = cache1.GetTemplate(filename.c_str(), DO_NOT_STRIP);
    const Template* tpl3 = cache1.GetTemplate(filename, STRIP_WHITESPACE);
    ASSERT(tpl1 && tpl2 && tpl3);
    ASSERT(tpl1 == tpl2);
    ASSERT(tpl1 != tpl3);
    AssertExpandIs(tpl1, &empty_dict, text, true);
    AssertExpandIs(tpl2, &empty_dict, text, true);
    AssertExpandIs(tpl3, &empty_dict, text, true);

    // Tests that a nonexistent template returns NULL
    const Template* tpl4 = cache1.GetTemplate("/yakakak", STRIP_WHITESPACE);
    ASSERT(!tpl4);

    // Make sure we get different results if we use a different cache.
    TemplateCache cache2;
    const Template* tpl5 = cache2.GetTemplate(filename, DO_NOT_STRIP);
    ASSERT(tpl5);
    ASSERT(tpl5 != tpl1);
    AssertExpandIs(tpl5, &empty_dict, text, true);

    // And different results yet if we use the default cache.
    const Template* tpl6 = Template::GetTemplate(filename, DO_NOT_STRIP);
    ASSERT(tpl6);
    ASSERT(tpl6 != tpl1);
    AssertExpandIs(tpl6, &empty_dict, text, true);
  }